

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O2

Float __thiscall
pbrt::TrowbridgeReitzDistribution::Lambda(TrowbridgeReitzDistribution *this,Vector3f *w)

{
  Float FVar1;
  Float FVar2;
  float fVar3;
  undefined1 auVar4 [16];
  float fVar5;
  
  fVar5 = (w->super_Tuple3<pbrt::Vector3,_float>).z;
  fVar5 = fVar5 * fVar5;
  auVar4._0_12_ = ZEXT812(0);
  auVar4._12_4_ = 0;
  fVar3 = 0.0;
  auVar4 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar5)),auVar4);
  fVar5 = auVar4._0_4_ / fVar5;
  if (ABS(fVar5) != INFINITY) {
    FVar1 = Cos2Phi(w);
    fVar3 = this->alpha_x;
    FVar2 = Sin2Phi(w);
    auVar4 = vfmadd231ss_fma(ZEXT416((uint)(FVar2 * this->alpha_y * this->alpha_y)),
                             ZEXT416((uint)(fVar3 * fVar3)),ZEXT416((uint)FVar1));
    auVar4 = vfmadd213ss_fma(ZEXT416((uint)fVar5),auVar4,ZEXT416(0x3f800000));
    if (auVar4._0_4_ < 0.0) {
      fVar5 = sqrtf(auVar4._0_4_);
    }
    else {
      auVar4 = vsqrtss_avx(auVar4,auVar4);
      fVar5 = auVar4._0_4_;
    }
    fVar3 = (fVar5 + -1.0) * 0.5;
  }
  return fVar3;
}

Assistant:

PBRT_CPU_GPU
inline Float Cos2Theta(const Vector3f &w) {
    return w.z * w.z;
}